

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeCheckTable(sqlite3 *db,char *zDb,char *zTab,char **pzReport)

{
  int iVar1;
  int iVar2;
  sqlite3_stmt *psVar3;
  int rc_1;
  int rc;
  int nAux;
  int bEnd;
  sqlite3_stmt *pStmt;
  RtreeCheck check;
  char **pzReport_local;
  char *zTab_local;
  char *zDb_local;
  sqlite3 *db_local;
  
  rc_1 = 0;
  check._80_8_ = pzReport;
  memset(&pStmt,0,0x58);
  pStmt = (sqlite3_stmt *)db;
  check.db = (sqlite3 *)zDb;
  check.zDb = zTab;
  iVar1 = sqlite3_get_autocommit(db);
  if (iVar1 != 0) {
    check.nLeaf = sqlite3_exec(db,"BEGIN",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
  }
  if (check.nLeaf == 0) {
    psVar3 = rtreeCheckPrepare((RtreeCheck *)&pStmt,"SELECT * FROM %Q.\'%q_rowid\'",zDb,zTab);
    if (psVar3 != (sqlite3_stmt *)0x0) {
      iVar2 = sqlite3_column_count(psVar3);
      rc_1 = iVar2 + -2;
      sqlite3_finalize(psVar3);
    }
    check.nLeaf = 0;
  }
  psVar3 = rtreeCheckPrepare((RtreeCheck *)&pStmt,"SELECT * FROM %Q.%Q",zDb,zTab);
  if (psVar3 != (sqlite3_stmt *)0x0) {
    iVar2 = sqlite3_column_count(psVar3);
    iVar2 = (iVar2 + -1) - rc_1;
    check.zTab._4_4_ = iVar2 / 2;
    if (check.zTab._4_4_ < 1) {
      rtreeCheckAppendMsg((RtreeCheck *)&pStmt,"Schema corrupt or not an rtree",
                          (long)iVar2 % 2 & 0xffffffff);
    }
    else {
      iVar2 = sqlite3_step(psVar3);
      if (iVar2 == 100) {
        iVar2 = sqlite3_column_type(psVar3,1);
        check.zTab._0_4_ = (uint)(iVar2 == 1);
      }
    }
    iVar2 = sqlite3_finalize(psVar3);
    if (iVar2 != 0xb) {
      check.nLeaf = iVar2;
    }
  }
  if (0 < check.zTab._4_4_) {
    if (check.nLeaf == 0) {
      rtreeCheckNode((RtreeCheck *)&pStmt,0,(u8 *)0x0,1);
    }
    rtreeCheckCount((RtreeCheck *)&pStmt,"_rowid",(long)(int)check.aCheckMapping[1]);
    rtreeCheckCount((RtreeCheck *)&pStmt,"_parent",(long)check.aCheckMapping[1]._4_4_);
  }
  sqlite3_finalize((sqlite3_stmt *)check._24_8_);
  sqlite3_finalize(check.pGetNode);
  sqlite3_finalize(check.aCheckMapping[0]);
  if ((iVar1 != 0) &&
     (iVar1 = sqlite3_exec(db,"END",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0),
     check.nLeaf == 0)) {
    check.nLeaf = iVar1;
  }
  *(undefined8 *)check._80_8_ = check._64_8_;
  return check.nLeaf;
}

Assistant:

static int rtreeCheckTable(
  sqlite3 *db,                    /* Database handle to access db through */
  const char *zDb,                /* Name of db ("main", "temp" etc.) */
  const char *zTab,               /* Name of rtree table to check */
  char **pzReport                 /* OUT: sqlite3_malloc'd report text */
){
  RtreeCheck check;               /* Common context for various routines */
  sqlite3_stmt *pStmt = 0;        /* Used to find column count of rtree table */
  int bEnd = 0;                   /* True if transaction should be closed */
  int nAux = 0;                   /* Number of extra columns. */

  /* Initialize the context object */
  memset(&check, 0, sizeof(check));
  check.db = db;
  check.zDb = zDb;
  check.zTab = zTab;

  /* If there is not already an open transaction, open one now. This is
  ** to ensure that the queries run as part of this integrity-check operate
  ** on a consistent snapshot.  */
  if( sqlite3_get_autocommit(db) ){
    check.rc = sqlite3_exec(db, "BEGIN", 0, 0, 0);
    bEnd = 1;
  }

  /* Find the number of auxiliary columns */
  if( check.rc==SQLITE_OK ){
    pStmt = rtreeCheckPrepare(&check, "SELECT * FROM %Q.'%q_rowid'", zDb, zTab);
    if( pStmt ){
      nAux = sqlite3_column_count(pStmt) - 2;
      sqlite3_finalize(pStmt);
    }
    check.rc = SQLITE_OK;
  }

  /* Find number of dimensions in the rtree table. */
  pStmt = rtreeCheckPrepare(&check, "SELECT * FROM %Q.%Q", zDb, zTab);
  if( pStmt ){
    int rc;
    check.nDim = (sqlite3_column_count(pStmt) - 1 - nAux) / 2;
    if( check.nDim<1 ){
      rtreeCheckAppendMsg(&check, "Schema corrupt or not an rtree");
    }else if( SQLITE_ROW==sqlite3_step(pStmt) ){
      check.bInt = (sqlite3_column_type(pStmt, 1)==SQLITE_INTEGER);
    }
    rc = sqlite3_finalize(pStmt);
    if( rc!=SQLITE_CORRUPT ) check.rc = rc;
  }

  /* Do the actual integrity-check */
  if( check.nDim>=1 ){
    if( check.rc==SQLITE_OK ){
      rtreeCheckNode(&check, 0, 0, 1);
    }
    rtreeCheckCount(&check, "_rowid", check.nLeaf);
    rtreeCheckCount(&check, "_parent", check.nNonLeaf);
  }

  /* Finalize SQL statements used by the integrity-check */
  sqlite3_finalize(check.pGetNode);
  sqlite3_finalize(check.aCheckMapping[0]);
  sqlite3_finalize(check.aCheckMapping[1]);

  /* If one was opened, close the transaction */
  if( bEnd ){
    int rc = sqlite3_exec(db, "END", 0, 0, 0);
    if( check.rc==SQLITE_OK ) check.rc = rc;
  }
  *pzReport = check.zReport;
  return check.rc;
}